

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_add_elements_raw_output_at
              (wally_tx *tx,uint32_t index,uint64_t satoshi,uchar *script,size_t script_len,
              uchar *asset,size_t asset_len,uchar *value,size_t value_len,uchar *nonce,
              size_t nonce_len,uchar *surjectionproof,size_t surjectionproof_len,uchar *rangeproof,
              size_t rangeproof_len,uint32_t flags,_Bool is_elements)

{
  int iVar1;
  wally_tx_output local_98;
  
  local_98.features = is_elements;
  local_98.asset_len = asset_len;
  local_98.value = value;
  local_98.value_len = value_len;
  local_98.nonce = nonce;
  local_98.nonce_len = nonce_len;
  local_98.surjectionproof = surjectionproof;
  local_98.surjectionproof_len = surjectionproof_len;
  local_98.rangeproof = rangeproof;
  local_98.rangeproof_len = rangeproof_len;
  iVar1 = -2;
  if ((((flags == 0) && ((asset != (uchar *)0x0) != (asset_len != 0x21))) &&
      ((value != (uchar *)0x0) != (value_len != 9 && value_len != 0x21))) &&
     ((((nonce != (uchar *)0x0) != (nonce_len != 0x21) &&
       ((surjectionproof != (uchar *)0x0) != (surjectionproof_len == 0))) &&
      ((rangeproof != (uchar *)0x0) != (rangeproof_len == 0))))) {
    local_98.satoshi = satoshi;
    local_98.script = script;
    local_98.script_len = script_len;
    local_98.asset = asset;
    iVar1 = wally_tx_add_output_at(tx,index,&local_98);
    wally_clear(&local_98,0x70);
  }
  return iVar1;
}

Assistant:

static int tx_add_elements_raw_output_at(
    struct wally_tx *tx, uint32_t index, uint64_t satoshi,
    const unsigned char *script, size_t script_len,
    const unsigned char *asset, size_t asset_len,
    const unsigned char *value, size_t value_len,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *surjectionproof, size_t surjectionproof_len,
    const unsigned char *rangeproof, size_t rangeproof_len,
    uint32_t flags, bool is_elements)
{
    /* Add an output without allocating a temporary wally_tx_output */
    struct wally_tx_output output = {
        satoshi, (unsigned char *)script, script_len,
        is_elements ? WALLY_TX_IS_ELEMENTS : 0,
#ifdef BUILD_ELEMENTS
        (unsigned char *)asset, asset_len, (unsigned char *)value, value_len,
        (unsigned char *)nonce, nonce_len, (unsigned char *)surjectionproof, surjectionproof_len,
        (unsigned char *)rangeproof, rangeproof_len,
#endif /* BUILD_ELEMENTS */
    };
    int ret;

    if (flags)
        return WALLY_EINVAL;

    if (BYTES_INVALID_N(asset, asset_len, WALLY_TX_ASSET_CT_ASSET_LEN) ||
        ((value != NULL) != (value_len == WALLY_TX_ASSET_CT_VALUE_LEN ||
                             value_len == WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN)) ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_CT_NONCE_LEN) ||
        BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

    ret = wally_tx_add_output_at(tx, index, &output);
    wally_clear(&output, sizeof(output));
    return ret;
}